

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O1

bool __thiscall
chrono::fea::ChContactTriangleXYZROT::IsSubBlockActive(ChContactTriangleXYZROT *this,int nblock)

{
  element_type *peVar1;
  byte bVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar3;
  
  if (nblock == 2) {
    peVar1 = (this->mnode3).
             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00 = (this->mnode3).
              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    iVar3 = (*(peVar1->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[3])();
    bVar2 = (byte)iVar3;
  }
  else if (nblock == 1) {
    peVar1 = (this->mnode2).
             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00 = (this->mnode2).
              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    iVar3 = (*(peVar1->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[3])();
    bVar2 = (byte)iVar3;
  }
  else {
    if (nblock != 0) {
      return false;
    }
    peVar1 = (this->mnode1).
             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00 = (this->mnode1).
              super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    iVar3 = (*(peVar1->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[3])();
    bVar2 = (byte)iVar3;
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return (bool)(bVar2 ^ 1);
}

Assistant:

bool ChContactTriangleXYZROT::IsSubBlockActive(int nblock) const {
    if (nblock == 0)
        return !GetNode1()->GetFixed();
    if (nblock == 1)
        return !GetNode2()->GetFixed();
    if (nblock == 2)
        return !GetNode3()->GetFixed();

    return false;
}